

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::QuantileListOperation<float,true>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  float fVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  AggregateUnaryInput input_data;
  float local_a4;
  Vector *local_a0;
  ulong local_98;
  idx_t local_90;
  ulong local_88;
  long local_80;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar8 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      local_98 = 0;
      uVar9 = 0;
      local_a0 = input;
      local_90 = count;
      local_80 = lVar8;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
LAB_004fdf5e:
          uVar7 = uVar9;
          if (uVar9 < uVar6) {
            do {
              fVar1 = *(float *)(lVar8 + uVar9 * 4);
              local_78.input = (AggregateInputData *)CONCAT44(local_78.input._4_4_,fVar1);
              iVar4._M_current = *(float **)(state + 8);
              if (iVar4._M_current == *(float **)(state + 0x10)) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          ((vector<float,_std::allocator<float>_> *)state,iVar4,(float *)&local_78);
              }
              else {
                *iVar4._M_current = fVar1;
                *(float **)(state + 8) = iVar4._M_current + 1;
              }
              uVar9 = uVar9 + 1;
              uVar7 = uVar6;
            } while (uVar6 != uVar9);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(input + 0x28) + local_98 * 8);
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
          input = local_a0;
          if (uVar2 == 0xffffffffffffffff) goto LAB_004fdf5e;
          uVar7 = uVar6;
          if ((uVar2 != 0) && (uVar7 = uVar9, count = local_90, uVar9 < uVar6)) {
            lVar5 = uVar9 * 4 + lVar8;
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                fVar1 = *(float *)(lVar5 + uVar10 * 4);
                local_78.input = (AggregateInputData *)CONCAT44(local_78.input._4_4_,fVar1);
                iVar4._M_current = *(float **)(state + 8);
                if (iVar4._M_current == *(float **)(state + 0x10)) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            ((vector<float,_std::allocator<float>_> *)state,iVar4,(float *)&local_78
                            );
                  lVar8 = local_80;
                }
                else {
                  *iVar4._M_current = fVar1;
                  *(float **)(state + 8) = iVar4._M_current + 1;
                }
              }
              uVar10 = uVar10 + 1;
              uVar7 = uVar6;
              count = local_90;
              input = local_a0;
            } while (uVar6 - uVar9 != uVar10);
          }
        }
        local_98 = local_98 + 1;
        uVar9 = uVar7;
      } while (local_98 != local_88);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      QuantileOperation::
      ConstantOperation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<float,true>>
                ((QuantileState<float,_duckdb::QuantileStandardType> *)state,
                 *(float **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar3 = ((local_78.input)->bind_data).ptr;
        uVar9 = 0;
        do {
          uVar6 = uVar9;
          if (pFVar3 != (FunctionData *)0x0) {
            uVar6 = (ulong)*(uint *)(pFVar3 + uVar9 * 4);
          }
          local_a4 = *(float *)((long)&((local_78.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               uVar6 * 4);
          iVar4._M_current = *(float **)(state + 8);
          if (iVar4._M_current == *(float **)(state + 0x10)) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      ((vector<float,_std::allocator<float>_> *)state,iVar4,&local_a4);
          }
          else {
            *iVar4._M_current = local_a4;
            *(float **)(state + 8) = iVar4._M_current + 1;
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
    }
    else if (count != 0) {
      pFVar3 = ((local_78.input)->bind_data).ptr;
      uVar9 = 0;
      do {
        uVar6 = uVar9;
        if (pFVar3 != (FunctionData *)0x0) {
          uVar6 = (ulong)*(uint *)(pFVar3 + uVar9 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
          local_a4 = *(float *)((long)&((local_78.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               uVar6 * 4);
          iVar4._M_current = *(float **)(state + 8);
          if (iVar4._M_current == *(float **)(state + 0x10)) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      ((vector<float,_std::allocator<float>_> *)state,iVar4,&local_a4);
          }
          else {
            *iVar4._M_current = local_a4;
            *(float **)(state + 8) = iVar4._M_current + 1;
          }
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}